

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_refine_qualities.cpp
# Opt level: O3

Reals __thiscall Omega_h::refine_qualities_tmpl<3,1>(Omega_h *this,Mesh *mesh,LOs *candidates)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Alloc *pAVar3;
  Mesh *pMVar4;
  Alloc *this_00;
  Alloc *this_01;
  Alloc *this_02;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar5;
  LO size_in;
  size_t sVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  Reals RVar10;
  Write<double> quals_w;
  Reals cand_quals;
  Reals coords;
  LOs cv2v;
  LOs ev2v;
  MetricRefineQualities<3,_3> measure;
  Read<signed_char> ec_codes;
  LOs ec2c;
  LOs e2ec;
  type f;
  Adj e2c;
  Write<double> local_200;
  LOs local_1f0;
  Alloc *local_1e0;
  void *local_1d8;
  Write<double> local_1d0;
  Read<signed_char> local_1c0;
  LOs local_1b0;
  Alloc *local_1a0;
  element_type *local_198;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  element_type *local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_180;
  element_type *local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_168;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_160;
  Mesh *local_158;
  Alloc *local_150;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_148;
  Alloc *local_140;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_138;
  Alloc *local_130;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  Alloc *local_120;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_118;
  Alloc *local_110;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  undefined1 local_100 [32];
  Alloc *local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  Alloc *local_d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  Alloc *local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  Alloc *local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  Alloc *local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  Alloc *local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  Alloc *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  Alloc *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  Adj local_60;
  
  local_158 = (Mesh *)this;
  Mesh::ask_verts_of((Mesh *)&local_180,(Int)mesh);
  Mesh::ask_verts_of((Mesh *)&local_190,(Int)mesh);
  Mesh::ask_up(&local_60,mesh,1,3);
  local_110 = local_60.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_110 = (Alloc *)((local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  this_02 = local_110;
  local_108._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_120 = local_60.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_120 = (Alloc *)((local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  this_01 = local_120;
  local_160 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_118 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_130 = local_60.codes.write_.shared_alloc_.alloc;
  if (((ulong)local_60.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_130 = (Alloc *)((local_60.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.codes.write_.shared_alloc_.alloc)->use_count =
           (local_60.codes.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  this_00 = local_130;
  local_168 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_60.codes.write_.shared_alloc_.direct_ptr;
  local_128 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_60.codes.write_.shared_alloc_.direct_ptr;
  Mesh::coords((Mesh *)&local_1a0);
  local_1b0.write_.shared_alloc_.alloc = (candidates->write_).shared_alloc_.alloc;
  if (((ulong)local_1b0.write_.shared_alloc_.alloc & 1) == 0) {
    sVar6 = (local_1b0.write_.shared_alloc_.alloc)->size;
  }
  else {
    sVar6 = (ulong)local_1b0.write_.shared_alloc_.alloc >> 3;
  }
  if (((ulong)local_1b0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1b0.write_.shared_alloc_.alloc =
           (Alloc *)((local_1b0.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1b0.write_.shared_alloc_.alloc)->use_count =
           (local_1b0.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1b0.write_.shared_alloc_.direct_ptr = (candidates->write_).shared_alloc_.direct_ptr;
  local_170._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mesh;
  MetricRefineQualities<3,_1>::MetricRefineQualities
            ((MetricRefineQualities<3,_1> *)&local_150,mesh,&local_1b0);
  pAVar3 = local_1b0.write_.shared_alloc_.alloc;
  if (((ulong)local_1b0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1b0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1b0.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  local_100._0_8_ = (element_type *)(local_100 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"");
  size_in = (LO)(sVar6 >> 2);
  Write<double>::Write(&local_200,size_in,(string *)local_100);
  if ((element_type *)local_100._0_8_ != (element_type *)(local_100 + 0x10)) {
    operator_delete((void *)local_100._0_8_,(ulong)(local_100._16_8_ + 1));
  }
  local_100._0_8_ = (candidates->write_).shared_alloc_.alloc;
  if ((local_100._0_8_ & 7) == 0 && (Alloc *)local_100._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_100._0_8_ = ((Alloc *)local_100._0_8_)->size * 8 + 1;
    }
    else {
      ((Alloc *)local_100._0_8_)->use_count = ((Alloc *)local_100._0_8_)->use_count + 1;
    }
  }
  local_100._8_8_ = (candidates->write_).shared_alloc_.direct_ptr;
  local_100._16_8_ = local_180._M_pi;
  if (((ulong)local_180._M_pi & 7) == 0 && (Alloc *)local_180._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_100._16_8_ = (long)(local_180._M_pi)->_vptr__Sp_counted_base * 8 + 1;
    }
    else {
      *(int *)&local_180._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_180._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_100._24_8_ = local_178;
  local_e0 = local_1a0;
  if (((ulong)local_1a0 & 7) == 0 && local_1a0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e0 = (Alloc *)(local_1a0->size * 8 + 1);
    }
    else {
      local_1a0->use_count = local_1a0->use_count + 1;
    }
  }
  local_d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198;
  bVar7 = ((ulong)this_02 & 7) == 0;
  local_d0 = this_02;
  if (bVar7 && this_02 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d0 = (Alloc *)(this_02->size * 8 + 1);
    }
    else {
      this_02->use_count = this_02->use_count + 1;
    }
  }
  local_c8._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  bVar8 = ((ulong)this_01 & 7) == 0;
  local_c0 = this_01;
  if (bVar8 && this_01 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c0 = (Alloc *)(this_01->size * 8 + 1);
    }
    else {
      this_01->use_count = this_01->use_count + 1;
    }
  }
  local_b8._M_pi = local_160;
  bVar9 = ((ulong)this_00 & 7) == 0;
  local_b0 = this_00;
  if (bVar9 && this_00 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0 = (Alloc *)(this_00->size * 8 + 1);
    }
    else {
      this_00->use_count = this_00->use_count + 1;
    }
  }
  local_a8._M_pi = local_168;
  local_a0 = (Alloc *)local_190._M_pi;
  if (((ulong)local_190._M_pi & 7) == 0 && (Alloc *)local_190._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0 = (Alloc *)((long)(local_190._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_190._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_190._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188;
  local_90 = local_150;
  if (((ulong)local_150 & 7) == 0 && local_150 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90 = (Alloc *)(local_150->size * 8 + 1);
    }
    else {
      local_150->use_count = local_150->use_count + 1;
    }
  }
  local_88._M_pi = local_148;
  local_80 = local_140;
  if (((ulong)local_140 & 7) == 0 && local_140 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80 = (Alloc *)(local_140->size * 8 + 1);
    }
    else {
      local_140->use_count = local_140->use_count + 1;
    }
  }
  local_78._M_pi = local_138;
  local_70 = local_200.shared_alloc_.alloc;
  if (((ulong)local_200.shared_alloc_.alloc & 7) == 0 &&
      local_200.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70 = (Alloc *)((local_200.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_200.shared_alloc_.alloc)->use_count = (local_200.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_68._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200.shared_alloc_.direct_ptr;
  parallel_for<Omega_h::refine_qualities_tmpl<3,1>(Omega_h::Mesh*,Omega_h::Read<int>)::_lambda(int)_1_>
            (size_in,(type *)local_100,"refine_qualities");
  local_1d0.shared_alloc_.alloc = local_200.shared_alloc_.alloc;
  if (((ulong)local_200.shared_alloc_.alloc & 7) == 0 &&
      local_200.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1d0.shared_alloc_.alloc = (Alloc *)((local_200.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_200.shared_alloc_.alloc)->use_count = (local_200.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1d0.shared_alloc_.direct_ptr = local_200.shared_alloc_.direct_ptr;
  Read<double>::Read(&local_1c0,&local_1d0);
  pAVar3 = local_1d0.shared_alloc_.alloc;
  if (((ulong)local_1d0.shared_alloc_.alloc & 7) == 0 &&
      local_1d0.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1d0.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1d0.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  pMVar4 = local_158;
  local_1f0.write_.shared_alloc_.alloc = local_1c0.write_.shared_alloc_.alloc;
  if (((ulong)local_1c0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1c0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1f0.write_.shared_alloc_.alloc =
           (Alloc *)((local_1c0.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1c0.write_.shared_alloc_.alloc)->use_count =
           (local_1c0.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1f0.write_.shared_alloc_.direct_ptr = local_1c0.write_.shared_alloc_.direct_ptr;
  local_1e0 = (candidates->write_).shared_alloc_.alloc;
  if (((ulong)local_1e0 & 7) == 0 && local_1e0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1e0 = (Alloc *)(local_1e0->size * 8 + 1);
    }
    else {
      local_1e0->use_count = local_1e0->use_count + 1;
    }
  }
  local_1d8 = (candidates->write_).shared_alloc_.direct_ptr;
  Mesh::sync_subset_array<double>
            (local_158,(Int)local_170._M_pi,(Read<double> *)0x1,&local_1f0,-1.0,(Int)&local_1e0);
  pAVar3 = local_1e0;
  if (((ulong)local_1e0 & 7) == 0 && local_1e0 != (Alloc *)0x0) {
    piVar1 = &local_1e0->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1e0);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_1f0.write_.shared_alloc_.alloc;
  if (((ulong)local_1f0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1f0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1f0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1f0.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  if (((ulong)local_1c0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1c0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1c0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1c0.write_.shared_alloc_.alloc);
      operator_delete(local_1c0.write_.shared_alloc_.alloc,0x48);
    }
  }
  refine_qualities_tmpl<3,1>(Omega_h::Mesh*,Omega_h::Read<int>)::{lambda(int)#1}::~Mesh
            ((_lambda_int__1_ *)local_100);
  if (((ulong)local_200.shared_alloc_.alloc & 7) == 0 &&
      local_200.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_200.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_200.shared_alloc_.alloc);
      operator_delete(local_200.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_140 & 7) == 0 && local_140 != (Alloc *)0x0) {
    piVar1 = &local_140->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_140);
      operator_delete(local_140,0x48);
    }
  }
  if (((ulong)local_150 & 7) == 0 && local_150 != (Alloc *)0x0) {
    piVar1 = &local_150->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_150);
      operator_delete(local_150,0x48);
    }
  }
  if (((ulong)local_1a0 & 7) == 0 && local_1a0 != (Alloc *)0x0) {
    piVar1 = &local_1a0->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1a0);
      operator_delete(local_1a0,0x48);
    }
  }
  if (bVar9 && this_00 != (Alloc *)0x0) {
    piVar1 = &this_00->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_00);
      operator_delete(this_00,0x48);
    }
  }
  if (bVar8 && this_01 != (Alloc *)0x0) {
    piVar1 = &this_01->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_01);
      operator_delete(this_01,0x48);
    }
  }
  if (bVar7 && this_02 != (Alloc *)0x0) {
    piVar1 = &this_02->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_02);
      operator_delete(this_02,0x48);
    }
  }
  Adj::~Adj(&local_60);
  pvVar5 = extraout_RDX;
  if (((ulong)local_190._M_pi & 7) == 0 && (Alloc *)local_190._M_pi != (Alloc *)0x0) {
    p_Var2 = local_190._M_pi + 3;
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_190._M_pi);
      operator_delete(local_190._M_pi,0x48);
      pvVar5 = extraout_RDX_00;
    }
  }
  if (((ulong)local_180._M_pi & 7) == 0 && (Alloc *)local_180._M_pi != (Alloc *)0x0) {
    p_Var2 = local_180._M_pi + 3;
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_180._M_pi);
      operator_delete(local_180._M_pi,0x48);
      pvVar5 = extraout_RDX_01;
    }
  }
  RVar10.write_.shared_alloc_.direct_ptr = pvVar5;
  RVar10.write_.shared_alloc_.alloc = (Alloc *)pMVar4;
  return (Reals)RVar10.write_.shared_alloc_;
}

Assistant:

Reals refine_qualities_tmpl(Mesh* mesh, LOs candidates) {
  auto ev2v = mesh->ask_verts_of(EDGE);
  auto cv2v = mesh->ask_verts_of(mesh_dim);
  auto e2c = mesh->ask_up(EDGE, mesh_dim);
  auto e2ec = e2c.a2ab;
  auto ec2c = e2c.ab2b;
  auto ec_codes = e2c.codes;
  auto coords = mesh->coords();
  auto ncands = candidates.size();
  auto measure = MetricRefineQualities<mesh_dim, metric_dim>(mesh, candidates);
  Write<Real> quals_w(ncands);
  auto f = OMEGA_H_LAMBDA(LO cand) {
    auto e = candidates[cand];
    auto eev2v = gather_verts<2>(ev2v, e);
    auto ep = gather_vectors<2, mesh_dim>(coords, eev2v);
    auto midp = (ep[0] + ep[1]) / 2.;
    auto minqual = 1.0;
    for (auto ec = e2ec[e]; ec < e2ec[e + 1]; ++ec) {
      auto c = ec2c[ec];
      auto code = ec_codes[ec];
      auto cce = code_which_down(code);
      auto rot = code_rotation(code);
      auto ccv2v = gather_verts<mesh_dim + 1>(cv2v, c);
      for (Int eev = 0; eev < 2; ++eev) {
        /* a new cell is formed from an old cell by finding
           its side that is opposite to one of the edge endpoints
           and connecting it to the midpoint to form the new cell
           (see refine_domain_interiors) */
        auto cev = eev ^ rot;
        auto ccv = simplex_down_template(mesh_dim, EDGE, cce, cev);
        auto ccs = simplex_opposite_template(mesh_dim, VERT, ccv);
        Few<LO, mesh_dim> csv2v;
        Few<Vector<mesh_dim>, mesh_dim + 1> ncp;
        for (Int csv = 0; csv < mesh_dim; ++csv) {
          auto ccv2 = simplex_down_template(mesh_dim, mesh_dim - 1, ccs, csv);
          auto v2 = ccv2v[ccv2];
          csv2v[csv] = v2;
          ncp[csv] = get_vector<mesh_dim>(coords, v2);
        }
        ncp[mesh_dim] = midp;
        flip_new_elem<mesh_dim>(&csv2v[0]);
        flip_new_elem<mesh_dim>(&ncp[0]);
        auto cqual = measure.measure(cand, ncp, csv2v);
        minqual = min2(minqual, cqual);
      }
    }
    quals_w[cand] = minqual;
  };
  parallel_for(ncands, f, "refine_qualities");
  auto cand_quals = Reals(quals_w);
  return mesh->sync_subset_array(EDGE, cand_quals, candidates, -1.0, 1);
}